

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name.cc
# Opt level: O2

bool bssl::ConvertToRFC2253(RDNSequence *rdn_sequence,string *out)

{
  pointer pXVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  pointer this;
  long lVar5;
  string rdn_string;
  RelativeDistinguishedName rdn;
  string atv_string;
  string rdns_string;
  
  rdns_string._M_dataplus._M_p = (pointer)&rdns_string.field_2;
  rdns_string._M_string_length = 0;
  rdns_string.field_2._M_local_buf[0] = '\0';
  lVar5 = (long)(rdn_sequence->
                super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(rdn_sequence->
                super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = lVar5 / 0x18;
  uVar4 = 0;
  do {
    if (uVar4 == uVar3) {
      ::std::__cxx11::string::_M_assign((string *)out);
LAB_0037ef30:
      ::std::__cxx11::string::~string((string *)&rdns_string);
      return uVar3 <= uVar4;
    }
    ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::vector
              (&rdn,(vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                    ((long)(rdn_sequence->
                           super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + ~uVar4 * 0x18 + lVar5));
    pXVar1 = rdn.
             super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    rdn_string._M_string_length = 0;
    rdn_string.field_2._M_local_buf[0] = '\0';
    rdn_string._M_dataplus._M_p = (pointer)&rdn_string.field_2;
    for (this = rdn.
                super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start; this != pXVar1; this = this + 1) {
      if (rdn_string._M_string_length != 0) {
        ::std::__cxx11::string::append((char *)&rdn_string);
      }
      atv_string._M_string_length = 0;
      atv_string.field_2._M_local_buf[0] = '\0';
      atv_string._M_dataplus._M_p = (pointer)&atv_string.field_2;
      bVar2 = X509NameAttribute::AsRFC2253String(this,&atv_string);
      if (!bVar2) {
        ::std::__cxx11::string::~string((string *)&atv_string);
        ::std::__cxx11::string::~string((string *)&rdn_string);
        ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
        ~_Vector_base(&rdn.
                       super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                     );
        goto LAB_0037ef30;
      }
      ::std::__cxx11::string::append((string *)&rdn_string);
      ::std::__cxx11::string::~string((string *)&atv_string);
    }
    if (rdns_string._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)&rdns_string);
    }
    ::std::__cxx11::string::append((string *)&rdns_string);
    ::std::__cxx11::string::~string((string *)&rdn_string);
    ::std::_Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::
    ~_Vector_base(&rdn.
                   super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                 );
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool ParseNameValue(der::Input name_value, RDNSequence *out) {
  der::Parser rdn_sequence_parser(name_value);
  while (rdn_sequence_parser.HasMore()) {
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }
    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }
    out->push_back(type_and_values);
  }

  return true;
}